

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_move_key_anchor_to_val_anchor(Parser *this)

{
  long in_RDI;
  bool bVar1;
  Parser *in_stack_00000470;
  csubstr in_stack_00000478;
  basic_substring<char_const> local_28 [24];
  long *local_10;
  long *local_8;
  
  local_8 = (long *)(in_RDI + 0xa50);
  bVar1 = true;
  if (*(long *)(in_RDI + 0xa58) != 0) {
    bVar1 = *local_8 == 0;
  }
  if (!bVar1) {
    local_10 = (long *)(in_RDI + 0xa68);
    bVar1 = true;
    if (*(long *)(in_RDI + 0xa70) != 0) {
      bVar1 = *local_10 == 0;
    }
    if (!bVar1) {
      bVar1 = is_debugger_attached();
      if ((bVar1) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      basic_substring<char_const>::basic_substring<29ul>
                (local_28,(char (*) [29])"ERROR: triple-pending anchor");
      _err<>(in_stack_00000470,in_stack_00000478);
    }
    *(undefined8 *)(in_RDI + 0xa68) = *(undefined8 *)(in_RDI + 0xa50);
    *(undefined8 *)(in_RDI + 0xa70) = *(undefined8 *)(in_RDI + 0xa58);
    *(undefined8 *)(in_RDI + 0xa60) = *(undefined8 *)(in_RDI + 0xa48);
    basic_substring<const_char>::operator=
              ((basic_substring<const_char> *)(in_RDI + 0xa50),(nullptr_t)0x0);
    *(undefined8 *)(in_RDI + 0xa48) = 0;
  }
  return;
}

Assistant:

void Parser::_move_key_anchor_to_val_anchor()
{
    if(m_key_anchor.empty())
        return;
    _c4dbgpf("move current key anchor to val slot: key='{}' -> val='{}'", m_key_anchor, m_val_anchor);
    if(!m_val_anchor.empty())
        _c4err("triple-pending anchor");
    m_val_anchor = m_key_anchor;
    m_val_anchor_indentation = m_key_anchor_indentation;
    m_key_anchor = {};
    m_key_anchor_indentation = {};
}